

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O0

void __thiscall
OpenMD::RectMatrix<double,_3U,_3U>::sub
          (RectMatrix<double,_3U,_3U> *this,RectMatrix<double,_3U,_3U> *m1,
          RectMatrix<double,_3U,_3U> *m2)

{
  uint j;
  uint i;
  RectMatrix<double,_3U,_3U> *m2_local;
  RectMatrix<double,_3U,_3U> *m1_local;
  RectMatrix<double,_3U,_3U> *this_local;
  
  for (i = 0; i < 3; i = i + 1) {
    for (j = 0; j < 3; j = j + 1) {
      this->data_[i][j] = m1->data_[i][j] - m2->data_[i][j];
    }
  }
  return;
}

Assistant:

inline void sub(const RectMatrix<Real, Row, Col>& m1,
                    const RectMatrix<Real, Row, Col>& m2) {
      for (unsigned int i = 0; i < Row; i++)
        for (unsigned int j = 0; j < Col; j++)
          this->data_[i][j] = m1.data_[i][j] - m2.data_[i][j];
    }